

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
 __thiscall ninx::parser::Parser::parse_function_call_argument(Parser *this)

{
  string *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __p;
  int iVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  string *in_RSI;
  allocator local_59;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id;
  _Alloc_hider local_48;
  
  id._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  this_00 = in_RSI + 1;
  iVar1 = TokenReader::check_limiter((TokenReader *)this_00,'{');
  if (iVar1 == 0) {
    pTVar2 = TokenReader::peek_token((TokenReader *)this_00);
    iVar1 = (*pTVar2->_vptr_Token[2])(pTVar2);
    if (iVar1 != 3) {
      pTVar2 = TokenReader::get_token((TokenReader *)this_00);
      iVar1 = (*pTVar2->_vptr_Token[2])(pTVar2);
      if (iVar1 != 0) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffb8,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,(allocator *)&id_ptr);
        exception::ParserException::ParserException
                  (pPVar3,pTVar2,in_RSI,(string *)&stack0xffffffffffffffb8);
        __cxa_throw(pPVar3,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      __dynamic_cast(pTVar2,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
      lexer::token::Text::get_identifier_abi_cxx11_((Text *)&id_ptr);
      __p = id_ptr;
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )id_ptr._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffb8,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,&local_59);
        exception::ParserException::ParserException
                  (pPVar3,pTVar2,in_RSI,(string *)&stack0xffffffffffffffb8);
        __cxa_throw(pPVar3,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      id_ptr._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&id,(pointer)__p._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      iVar1 = TokenReader::check_limiter((TokenReader *)this_00,'=');
      if (iVar1 != 1) {
        pTVar2 = TokenReader::get_token((TokenReader *)this_00);
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffb8,
                   "Expected \'=\' after argument name, but could not find one.",&local_59);
        exception::ParserException::ParserException
                  (pPVar3,pTVar2,in_RSI,(string *)&stack0xffffffffffffffb8);
        __cxa_throw(pPVar3,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      TokenReader::get_token((TokenReader *)this_00);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&id_ptr);
    }
  }
  parse_level_3_expression((Parser *)&stack0xffffffffffffffb8);
  std::
  make_unique<ninx::parser::element::FunctionCallArgument,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
            ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                      *)&id);
  if ((long *)local_48._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_p + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&id);
  return (__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallArgument> ninx::parser::Parser::parse_function_call_argument() {
    // Check if the function call argument use implicit naming ( without the argument name )
    // to do that, check if there is the beginning of a block.

    std::unique_ptr<std::string> id{nullptr}; // Argument name

    if (reader.check_limiter('{') == 0 && reader.peek_token()->get_type() != Type::VARIABLE) {
        auto raw_token{reader.get_token()};

        if (raw_token->get_type() != Type::TEXT) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(raw_token)->get_identifier()};
        if (!id_ptr) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        id = std::move(id_ptr);

        if (reader.check_limiter('=') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin,
                                  "Expected '=' after argument name, but could not find one.");
        }
        reader.get_token();  // Skip the = limiter
    }

    auto value{parse_expression()};

    auto argument = std::make_unique<FunctionCallArgument>(std::move(id), std::move(value));

    return argument;
}